

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O0

bool __thiscall ON_UserData::IsValid(ON_UserData *this,ON_TextLog *text_log)

{
  int iVar1;
  uint uVar2;
  ON_ClassId *pOVar3;
  undefined4 extraout_var;
  bool bVar4;
  ON_UUID local_50;
  ON_UUID local_40;
  ON_UUID local_30;
  ON_TextLog *local_20;
  ON_TextLog *text_log_local;
  ON_UserData *this_local;
  
  local_20 = text_log;
  text_log_local = (ON_TextLog *)this;
  iVar1 = ON_UuidCompare(&this->m_userdata_uuid,&ON_nil_uuid);
  if (iVar1 == 0) {
    if (local_20 != (ON_TextLog *)0x0) {
      ON_TextLog::Print(local_20,"invalid userdata - m_userdata_uuid = nil\n");
    }
    this_local._7_1_ = false;
  }
  else {
    pOVar3 = ClassId(this);
    local_30 = ON_ClassId::Uuid(pOVar3);
    iVar1 = ON_UuidCompare(&this->m_userdata_uuid,&local_30);
    if (iVar1 == 0) {
      if (local_20 != (ON_TextLog *)0x0) {
        ON_TextLog::Print(local_20,
                          "invalid userdata - m_userdata_uuid in use. Use guidgen to get a unique id.\n"
                         );
      }
      this_local._7_1_ = false;
    }
    else {
      uVar2 = (*(this->super_ON_Object)._vptr_ON_Object[0x19])();
      bVar4 = false;
      if ((uVar2 & 1) != 0) {
        iVar1 = (**(this->super_ON_Object)._vptr_ON_Object)();
        local_40 = ON_ClassId::Uuid((ON_ClassId *)CONCAT44(extraout_var,iVar1));
        pOVar3 = ClassId(this);
        local_50 = ON_ClassId::Uuid(pOVar3);
        iVar1 = ON_UuidCompare(&local_40,&local_50);
        bVar4 = iVar1 == 0;
      }
      if (bVar4) {
        if (local_20 != (ON_TextLog *)0x0) {
          ON_TextLog::Print(local_20,
                            "invalid userdata - classes derived from ON_UserData that get saved in 3dm archives must have a class id and name defined by ON_OBJECT_DECLARE/ON_OBJECT_IMPLEMENT.\n"
                           );
        }
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_UserData::IsValid( ON_TextLog* text_log ) const
{
  if ( 0 == ON_UuidCompare( &m_userdata_uuid, &ON_nil_uuid ) )
  {
    if ( 0 != text_log )
    {
      text_log->Print("invalid userdata - m_userdata_uuid = nil\n");
    }
    return false;
  }

  if ( 0 == ON_UuidCompare( m_userdata_uuid, ON_UserData::ClassId()->Uuid() ) )
  {
    if ( 0 != text_log )
    {
      text_log->Print("invalid userdata - m_userdata_uuid in use. Use guidgen to get a unique id.\n");
    }
    return false;
  }

  if ( Archive() && 0 == ON_UuidCompare( ClassId()->Uuid(), ON_UserData::ClassId()->Uuid() ) )
  {
    // 8 January 2004 Dale Lear:
    //  I added this test to help developers remember to use
    //  the ON_DECLARE_OBJECT/ON_IMPLEMENT_OBJECT macros when
    //  they create user data that gets archived.
    if ( 0 != text_log )
    {
      text_log->Print("invalid userdata - classes derived from ON_UserData that get saved in 3dm archives must have a class id and name defined by ON_OBJECT_DECLARE/ON_OBJECT_IMPLEMENT.\n");
    }
    return false;
  }

  return true;
}